

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharMap.h
# Opt level: O0

bool __thiscall
UnifiedRegex::CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetNonDirect
          (CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1> *this,uint k,int *lastOcc)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  Leaf *leaf;
  uint i;
  Inner *inner;
  Type pNStack_30;
  int level;
  Node *curr;
  int *lastOcc_local;
  uint k_local;
  CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1> *this_local;
  
  if (k < 0x100) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharMap.h"
                       ,0x117,"(k >= directSize)","k >= directSize");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (this->root == (Type)0x0) {
    this_local._7_1_ = false;
  }
  else {
    pNStack_30 = this->root;
    for (inner._4_4_ = 3; 0 < inner._4_4_; inner._4_4_ = inner._4_4_ + -1) {
      uVar3 = innerIdx(inner._4_4_,k);
      if (pNStack_30[(ulong)uVar3 + 1]._vptr_Node == (_func_int **)0x0) {
        return false;
      }
      pNStack_30 = (Type)pNStack_30[(ulong)uVar3 + 1]._vptr_Node;
    }
    uVar3 = leafIdx(k);
    *lastOcc = *(int *)((long)&pNStack_30[1]._vptr_Node + (ulong)uVar3 * 4);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool GetNonDirect(uint k, V& lastOcc) const
        {
            Assert(k >= directSize);
            if (root == nullptr)
            {
                return false;
            }
            Node* curr = root;
            for (int level = levels - 1; level > 0; level--)
            {
                Inner* inner = (Inner*)curr;
                uint i = innerIdx(level, k);
                if (inner->children[i] == 0)
                    return false;
                else
                    curr = inner->children[i];
            }
            Leaf* leaf = (Leaf*)curr;
            lastOcc = leaf->values[leafIdx(k)];
            return true;
        }